

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.cpp
# Opt level: O2

vector_type * __thiscall
nanoNet::NeuralNetwork::predict
          (vector_type *__return_storage_ptr__,NeuralNetwork *this,vector_type *inputData)

{
  pointer pNVar1;
  NeuralNetworkLayer *layer;
  pointer this_00;
  _Vector_base<float,_std::allocator<float>_> _Stack_38;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,inputData);
  pNVar1 = (this->m_layers).
           super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_layers).
                 super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1
      ) {
    NeuralNetworkLayer::predict((vector_type *)&_Stack_38,this_00,__return_storage_ptr__);
    std::vector<float,_std::allocator<float>_>::_M_move_assign(__return_storage_ptr__,&_Stack_38);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&_Stack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

NeuralNetworkLayer::vector_type NeuralNetwork::predict(
    const NeuralNetworkLayer::vector_type& inputData) const
{
    NeuralNetworkLayer::vector_type result(inputData);

    for (auto& layer : m_layers)
        result = layer.predict(result);

    return result;
}